

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

void __thiscall ON_SN_BLOCK::CullBlockHelper(ON_SN_BLOCK *this)

{
  SN_ELEMENT *pSVar1;
  SN_ELEMENT **ppSVar2;
  ON__UINT64 *pOVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ON__UINT64 OVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  MAP_VALUE *pMVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  long lVar15;
  
  uVar4 = this->m_count;
  if (uVar4 != 0) {
    uVar12 = 0;
    lVar15 = -0x70;
    do {
      if (this->m_sn[uVar12].m_sn_active == '\0') {
        if (uVar12 + 1 < uVar4) {
          iVar13 = (uVar4 - 1) - uVar12;
          pcVar14 = (char *)((long)this - lVar15);
          do {
            if (*pcVar14 != '\0') {
              this->m_sn[uVar12].m_value.m_u = *(anon_union_8_5_72d3814f_for_m_u *)(pcVar14 + 0x18);
              uVar4 = *(uint *)(pcVar14 + -0x18);
              uVar5 = *(undefined4 *)(pcVar14 + -0x14);
              uVar6 = *(undefined4 *)(pcVar14 + -0x10);
              uVar7 = *(undefined4 *)(pcVar14 + -0xc);
              OVar8 = *(ON__UINT64 *)(pcVar14 + -8);
              uVar9 = *(undefined8 *)pcVar14;
              uVar10 = *(undefined8 *)(pcVar14 + 0x10);
              ppSVar2 = &this->m_sn[uVar12].m_next;
              *ppSVar2 = *(SN_ELEMENT **)(pcVar14 + 8);
              pMVar11 = (MAP_VALUE *)(ppSVar2 + 1);
              pMVar11->m_u_type = (int)uVar10;
              pMVar11->m_u32 = (int)((ulong)uVar10 >> 0x20);
              pOVar3 = &this->m_sn[uVar12].m_sn;
              *pOVar3 = OVar8;
              pOVar3[1] = uVar9;
              pSVar1 = this->m_sn + uVar12;
              (pSVar1->m_id).Data1 = uVar4;
              (pSVar1->m_id).Data2 = (short)uVar5;
              (pSVar1->m_id).Data3 = (short)((uint)uVar5 >> 0x10);
              *(undefined4 *)(pSVar1->m_id).Data4 = uVar6;
              *(undefined4 *)((pSVar1->m_id).Data4 + 4) = uVar7;
              uVar12 = uVar12 + 1;
            }
            pcVar14 = pcVar14 + 0x38;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        if (uVar12 != 0) {
          this->m_count = uVar12;
          this->m_purged = 0;
          if (this->m_sorted == 0) {
            return;
          }
          this->m_sn0 = this->m_sn[0].m_sn;
          this->m_sn1 = this->m_sn[uVar12 - 1].m_sn;
          return;
        }
        this->m_count = 0;
        this->m_purged = 0;
        this->m_sorted = 1;
        this->m_sn0 = 0;
        this->m_sn1 = 0;
        return;
      }
      uVar12 = uVar12 + 1;
      lVar15 = lVar15 + -0x38;
    } while (uVar4 != uVar12);
  }
  return;
}

Assistant:

void ON_SN_BLOCK::CullBlockHelper()
{
  // Search the m_an[] array for elements whose m_u_type
  // value is zero and remove them from the array.
  //
  // This is a high speed helper function.  
  // The calling function must verify m_purged > 0.
  //
  // This function removes all m_sn[] elements
  // that have 0 == m_sn_active.

  ON__UINT32 i, j;
  for (i = 0; i < m_count; i++ )
  {
    if ( 0 == m_sn[i].m_sn_active )
    {
      for ( j = i+1; j < m_count; j++ )
      {
        if ( m_sn[j].m_sn_active )
        {
          m_sn[i++] = m_sn[j];
        }
      }
      if ( 0 == i )
      {
        EmptyBlock();
      }
      else
      {
        m_count = i;
        m_purged = 0;
        if ( m_sorted )
        {
          m_sn0 = m_sn[0].m_sn;
          m_sn1 = m_sn[m_count-1].m_sn;
        }
      }
      break;
    }
  }
}